

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

axbStatus_t op_vec_norm2(axbVec_s *x,axbScalar_s *norm,void *aux_data)

{
  double *pdVar1;
  double dVar2;
  ulong local_40;
  size_t i;
  double n;
  double *d_norm;
  double *d_x;
  void *aux_data_local;
  axbScalar_s *norm_local;
  axbVec_s *x_local;
  
  pdVar1 = (double *)norm->data;
  i = 0;
  for (local_40 = 0; local_40 < x->size; local_40 = local_40 + 1) {
    i = (size_t)(*(double *)((long)x->data + local_40 * 8) *
                 *(double *)((long)x->data + local_40 * 8) + (double)i);
  }
  dVar2 = sqrt((double)i);
  *pdVar1 = dVar2;
  return 0;
}

Assistant:

static axbStatus_t op_vec_norm2(const struct axbVec_s *x, struct axbScalar_s *norm, void *aux_data)
{
  (void)aux_data;

  const double *d_x    = (const double*)x->data;
        double *d_norm =       (double*)norm->data;

  double n = 0;
  for (size_t i=0; i<x->size; ++i) n += d_x[i] * d_x[i];
  *d_norm = sqrt(n);

  return 0;
}